

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XMLReader::getQName(XMLReader *this,XMLBuffer *toFill,int *colonPosition)

{
  bool bVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  
  bVar1 = getNCName(this,toFill);
  if (!bVar1) {
    *colonPosition = -1;
    return false;
  }
  XVar2 = this->fCharIndex;
  if (XVar2 == this->fCharsAvail) {
    bVar1 = refreshCharBuffer(this);
    if (!bVar1) goto LAB_002bc5fd;
    XVar2 = this->fCharIndex;
  }
  if (this->fCharBuf[XVar2] == L':') {
    XVar3 = toFill->fIndex;
    *colonPosition = (int)XVar3;
    if (XVar3 == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
      XVar3 = toFill->fIndex;
      XVar2 = this->fCharIndex;
    }
    toFill->fIndex = XVar3 + 1;
    toFill->fBuffer[XVar3] = L':';
    this->fCharIndex = XVar2 + 1;
    this->fCurCol = this->fCurCol + 1;
    bVar1 = getNCName(this,toFill);
    return bVar1;
  }
LAB_002bc5fd:
  *colonPosition = -1;
  return true;
}

Assistant:

bool XMLReader::getQName(XMLBuffer& toFill, int* colonPosition)
{
    // We are only looking for two iterations (i.e. 'NCNAME':'NCNAME').
    // We will stop when we finished scanning for a QName (i.e. either a second
    // colon or an invalid char).
    if(!getNCName(toFill))
    {
        *colonPosition = -1;
        return false;
    }
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
    {
        *colonPosition = -1;
        return true;
    }
    if (fCharBuf[fCharIndex] != chColon)
    {
        *colonPosition = -1;
        return true;
    }

    *colonPosition = (int)toFill.getLen();
    toFill.append(chColon);
    fCharIndex++;
    fCurCol++;
    return getNCName(toFill);
}